

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  Vector vector;
  int value;
  int x;
  Iterator end;
  int local_6c;
  ulong local_68;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_40 [16];
  undefined4 local_2c;
  undefined1 local_28 [16];
  
  puts("TESTING SETUP ...");
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  cVar1 = vector_is_initialized();
  if (cVar1 != '\0') {
    __assert_fail("!vector_is_initialized(&vector)",
                  "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                  ,0xb,"int main(int, const char **)");
  }
  uVar4 = 0;
  vector_setup(&local_68,0,4);
  cVar1 = vector_is_initialized(&local_68);
  if (cVar1 == '\0') {
    __assert_fail("vector_is_initialized(&vector)",
                  "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                  ,0xd,"int main(int, const char **)");
  }
  puts("TESTING INSERT ...");
  while (local_6c = (int)uVar4, local_6c < 1000) {
    iVar2 = vector_insert(&local_68,0,&local_6c);
    if (iVar2 != 0) {
      __assert_fail("vector_insert(&vector, 0, &i) == VECTOR_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x12,"int main(int, const char **)");
    }
    piVar3 = (int *)vector_get(&local_68);
    if (*piVar3 != local_6c) {
      __assert_fail("VECTOR_GET_AS(int, &vector, 0) == i",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x13,"int main(int, const char **)");
    }
    uVar4 = (long)local_6c + 1;
    if (local_68 != uVar4) {
      __assert_fail("vector.size == i + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x14,"int main(int, const char **)");
    }
  }
  local_2c = 5;
  vector_push_back(&local_68,&local_2c);
  vector_insert(&local_68,local_68,&local_2c);
  puts("TESTING ASSIGNMENT ...");
  local_6c = 0;
  if (local_68 != 0) {
    uVar4 = 0;
    do {
      local_40._0_4_ = 0x29a;
      iVar2 = vector_assign(&local_68,uVar4,local_40);
      if (iVar2 != 0) {
        __assert_fail("vector_assign(&vector, i, &value) == VECTOR_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                      ,0x1f,"int main(int, const char **)");
      }
      uVar4 = (long)local_6c + 1;
      local_6c = (int)uVar4;
    } while (uVar4 < local_68);
  }
  puts("TESTING ITERATION ...");
  local_40 = vector_begin(&local_68);
  local_28 = vector_end(&local_68);
  cVar1 = iterator_equals(local_40);
  if (cVar1 == '\0') {
    do {
      piVar3 = (int *)iterator_get(local_40);
      if (*piVar3 != 0x29a) {
        __assert_fail("ITERATOR_GET_AS(int, &iterator) == 666",
                      "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                      ,0x25,"int main(int, const char **)");
      }
      iterator_increment(local_40);
      cVar1 = iterator_equals(local_40,local_28);
    } while (cVar1 == '\0');
  }
  puts("TESTING REMOVAL ...");
  uVar4 = local_68;
  while( true ) {
    cVar1 = vector_is_empty(&local_68);
    if (cVar1 != '\0') break;
    iVar2 = vector_erase(&local_68,0);
    if (iVar2 != 0) {
      __assert_fail("vector_erase(&vector, 0) == VECTOR_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x2c,"int main(int, const char **)");
    }
    uVar4 = uVar4 - 1;
    if (uVar4 != local_68) {
      __assert_fail("vector.size == --expected_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x2d,"int main(int, const char **)");
    }
  }
  puts("TESTING RESIZE ...");
  iVar2 = vector_resize(&local_68,100);
  if (iVar2 != 0) {
    __assert_fail("vector_resize(&vector, 100) == VECTOR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                  ,0x31,"int main(int, const char **)");
  }
  if (local_68 != 100) {
    __assert_fail("vector.size == 100",
                  "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                  ,0x32,"int main(int, const char **)");
  }
  if (uStack_60 < 0x65) {
    __assert_fail("vector.capacity > 100",
                  "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                  ,0x33,"int main(int, const char **)");
  }
  puts("TESTING RESERVE ...");
  iVar2 = vector_reserve(&local_68,200);
  if (iVar2 == 0) {
    if (local_68 != 100) {
      __assert_fail("vector.size == 100",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x37,"int main(int, const char **)");
    }
    if (uStack_60 != 200) {
      __assert_fail("vector.capacity == 200",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x38,"int main(int, const char **)");
    }
    puts("TESTING CLEAR ...");
    iVar2 = vector_clear(&local_68);
    if (iVar2 != 0) {
      __assert_fail("vector_clear(&vector) == VECTOR_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x3b,"int main(int, const char **)");
    }
    if (local_68 == 0) {
      cVar1 = vector_is_empty(&local_68);
      if (cVar1 == '\0') {
        __assert_fail("vector_is_empty(&vector)",
                      "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                      ,0x3e,"int main(int, const char **)");
      }
      if (uStack_60 == 1) {
        vector_destroy(&local_68);
        puts("\x1b[92mALL TEST PASSED\x1b[0m");
        return 0;
      }
      __assert_fail("vector.capacity == VECTOR_MINIMUM_CAPACITY",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x3f,"int main(int, const char **)");
    }
    __assert_fail("vector.size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                  ,0x3d,"int main(int, const char **)");
  }
  __assert_fail("vector_reserve(&vector, 200) == VECTOR_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                ,0x36,"int main(int, const char **)");
}

Assistant:

int main(int argc, const char* argv[]) {
	int i;

	printf("TESTING SETUP ...\n");
	Vector vector = VECTOR_INITIALIZER;
	assert(!vector_is_initialized(&vector));
	vector_setup(&vector, 0, sizeof(int));
	assert(vector_is_initialized(&vector));

	printf("TESTING INSERT ...\n");

	for (i = 0; i < 1000; ++i) {
		assert(vector_insert(&vector, 0, &i) == VECTOR_SUCCESS);
		assert(VECTOR_GET_AS(int, &vector, 0) == i);
		assert(vector.size == i + 1);
	}

	int x = 5;
	vector_push_back(&vector, &x);
	vector_insert(&vector, vector.size, &x);

	printf("TESTING ASSIGNMENT ...\n");

	for (i = 0; i < vector.size; ++i) {
		int value = 666;
		assert(vector_assign(&vector, i, &value) == VECTOR_SUCCESS);
	}

	printf("TESTING ITERATION ...\n");

	VECTOR_FOR_EACH(&vector, iterator) {
		assert(ITERATOR_GET_AS(int, &iterator) == 666);
	}

	printf("TESTING REMOVAL ...\n");

	size_t expected_size = vector.size;
	while (!vector_is_empty(&vector)) {
		assert(vector_erase(&vector, 0) == VECTOR_SUCCESS);
		assert(vector.size == --expected_size);
	}

	printf("TESTING RESIZE ...\n");
	assert(vector_resize(&vector, 100) == VECTOR_SUCCESS);
	assert(vector.size == 100);
	assert(vector.capacity > 100);

	printf("TESTING RESERVE ...\n");
	assert(vector_reserve(&vector, 200) == VECTOR_SUCCESS);
	assert(vector.size == 100);
	assert(vector.capacity == 200);

	printf("TESTING CLEAR ...\n");
	assert(vector_clear(&vector) == VECTOR_SUCCESS);

	assert(vector.size == 0);
	assert(vector_is_empty(&vector));
	assert(vector.capacity == VECTOR_MINIMUM_CAPACITY);

	vector_destroy(&vector);

	printf("\033[92mALL TEST PASSED\033[0m\n");
}